

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O3

FT_Error cid_read_subrs(CID_Face face)

{
  uint uVar1;
  FT_Memory memory;
  FT_Stream stream;
  CID_FaceDict pCVar2;
  ulong uVar3;
  undefined8 *puVar4;
  CID_Subrs pCVar5;
  ulong *block;
  uchar *puVar6;
  FT_Byte **ppFVar7;
  FT_Byte *pFVar8;
  ulong uVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  FT_ULong count;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint local_44;
  FT_Error local_34 [2];
  FT_Error error;
  
  memory = (face->root).memory;
  stream = face->cid_stream;
  pvVar15 = face->psaux;
  block = (ulong *)0x0;
  pCVar5 = (CID_Subrs)ft_mem_realloc(memory,0x10,0,(long)(face->cid).num_dicts,(void *)0x0,local_34)
  ;
  face->subrs = pCVar5;
  if (local_34[0] == 0) {
    iVar11 = (face->cid).num_dicts;
    local_44 = 0;
    if (iVar11 < 1) {
      block = (ulong *)0x0;
    }
    else {
      lVar14 = 0;
      block = (ulong *)0x0;
      do {
        pCVar2 = (face->cid).font_dicts;
        uVar1 = pCVar2[lVar14].num_subrs;
        uVar13 = (ulong)uVar1;
        if (uVar13 != 0) {
          iVar11 = pCVar2[lVar14].private_dict.lenIV;
          uVar17 = uVar1 + 1;
          uVar9 = (ulong)uVar17;
          if (local_44 < uVar17) {
            uVar12 = (uVar1 & 0xfffffffc) + 4;
            if (local_44 < uVar12) {
              block = (ulong *)ft_mem_realloc(memory,8,(ulong)local_44,(ulong)uVar12,block,local_34)
              ;
              local_44 = uVar12;
              if (local_34[0] == 0) goto LAB_00200f95;
            }
            else {
              local_34[0] = 0xa0;
            }
          }
          else {
LAB_00200f95:
            local_34[0] = FT_Stream_Seek(stream,pCVar2[lVar14].subrmap_offset +
                                                (face->cid).data_offset);
            if ((local_34[0] == 0) &&
               (local_34[0] = FT_Stream_EnterFrame(stream,(ulong)(pCVar2[lVar14].sd_bytes * uVar17))
               , local_34[0] == 0)) {
              puVar6 = stream->cursor;
              uVar12 = pCVar2[lVar14].sd_bytes;
              uVar16 = 0;
              do {
                cVar10 = (char)uVar12;
                if (cVar10 == '\0') {
                  uVar18 = 0;
                }
                else {
                  lVar19 = 0;
                  uVar18 = 0;
                  do {
                    uVar18 = uVar18 << 8 | (ulong)puVar6[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (cVar10 != (char)lVar19);
                }
                block[uVar16] = uVar18;
                uVar16 = uVar16 + 1;
                puVar6 = puVar6 + (uVar12 & 0xff);
              } while (uVar16 != uVar17 + (uVar17 == 0));
              FT_Stream_ExitFrame(stream);
              uVar12 = 1;
              uVar16 = *block;
              do {
                uVar18 = (ulong)uVar12;
                if (block[uVar18] < uVar16) goto LAB_002011ad;
                uVar12 = uVar12 + 1;
                uVar16 = block[uVar18];
              } while (uVar12 <= uVar1);
              if (stream->size - (face->cid).data_offset < block[uVar13]) {
LAB_002011ad:
                local_34[0] = 3;
              }
              else {
                count = block[uVar13] - *block;
                ppFVar7 = (FT_Byte **)ft_mem_realloc(memory,8,0,uVar9,(void *)0x0,local_34);
                pCVar5->code = ppFVar7;
                if (local_34[0] == 0) {
                  pFVar8 = (FT_Byte *)ft_mem_alloc(memory,count,local_34);
                  *pCVar5->code = pFVar8;
                  if (((local_34[0] == 0) &&
                      (local_34[0] = FT_Stream_Seek(stream,*block + (face->cid).data_offset),
                      local_34[0] == 0)) &&
                     (local_34[0] = FT_Stream_Read(stream,*pCVar5->code,count), local_34[0] == 0)) {
                    if (uVar17 < 3) {
                      uVar9 = 2;
                    }
                    uVar18 = 1;
                    uVar16 = *block;
                    do {
                      uVar3 = block[uVar18];
                      pCVar5->code[uVar18] = pCVar5->code[uVar18 - 1] + (uVar3 - uVar16);
                      uVar18 = uVar18 + 1;
                      uVar16 = uVar3;
                    } while (uVar9 != uVar18);
                    if (-1 < iVar11) {
                      uVar9 = 0;
                      do {
                        uVar16 = uVar9 + 1;
                        (**(code **)((long)pvVar15 + 0x20))
                                  (pCVar5->code[uVar9],block[uVar9 + 1] - block[uVar9],0x10ea);
                        uVar9 = uVar16;
                      } while (uVar13 != uVar16);
                    }
                    pCVar5->num_subrs = uVar1;
                    iVar11 = (face->cid).num_dicts;
                    goto LAB_00201195;
                  }
                }
              }
            }
          }
          pCVar5 = face->subrs;
          if (pCVar5 != (CID_Subrs)0x0) {
            if (0 < (face->cid).num_dicts) {
              lVar14 = 8;
              lVar19 = 0;
              do {
                puVar4 = *(undefined8 **)((long)&pCVar5->num_subrs + lVar14);
                if (puVar4 == (undefined8 *)0x0) {
                  pvVar15 = (void *)0x0;
                }
                else {
                  ft_mem_free(memory,(void *)*puVar4);
                  **(undefined8 **)((long)&face->subrs->num_subrs + lVar14) = 0;
                  pvVar15 = *(void **)((long)&face->subrs->num_subrs + lVar14);
                }
                ft_mem_free(memory,pvVar15);
                pCVar5 = face->subrs;
                *(undefined8 *)((long)&pCVar5->num_subrs + lVar14) = 0;
                lVar19 = lVar19 + 1;
                lVar14 = lVar14 + 0x10;
              } while (lVar19 < (face->cid).num_dicts);
            }
            ft_mem_free(memory,pCVar5);
            face->subrs = (CID_Subrs)0x0;
          }
          break;
        }
LAB_00201195:
        lVar14 = lVar14 + 1;
        pCVar5 = pCVar5 + 1;
      } while (lVar14 < iVar11);
    }
  }
  ft_mem_free(memory,block);
  return local_34[0];
}

Assistant:

static FT_Error
  cid_read_subrs( CID_Face  face )
  {
    CID_FaceInfo   cid    = &face->cid;
    FT_Memory      memory = face->root.memory;
    FT_Stream      stream = face->cid_stream;
    FT_Error       error;
    FT_Int         n;
    CID_Subrs      subr;
    FT_UInt        max_offsets = 0;
    FT_ULong*      offsets = NULL;
    PSAux_Service  psaux = (PSAux_Service)face->psaux;


    if ( FT_NEW_ARRAY( face->subrs, cid->num_dicts ) )
      goto Exit;

    subr = face->subrs;
    for ( n = 0; n < cid->num_dicts; n++, subr++ )
    {
      CID_FaceDict  dict  = cid->font_dicts + n;
      FT_Int        lenIV = dict->private_dict.lenIV;
      FT_UInt       count, num_subrs = dict->num_subrs;
      FT_ULong      data_len;
      FT_Byte*      p;


      if ( !num_subrs )
        continue;

      /* reallocate offsets array if needed */
      if ( num_subrs + 1 > max_offsets )
      {
        FT_UInt  new_max = FT_PAD_CEIL( num_subrs + 1, 4 );


        if ( new_max <= max_offsets )
        {
          error = FT_THROW( Syntax_Error );
          goto Fail;
        }

        if ( FT_RENEW_ARRAY( offsets, max_offsets, new_max ) )
          goto Fail;

        max_offsets = new_max;
      }

      /* read the subrmap's offsets */
      if ( FT_STREAM_SEEK( cid->data_offset + dict->subrmap_offset )     ||
           FT_FRAME_ENTER( ( num_subrs + 1 ) * (FT_UInt)dict->sd_bytes ) )
        goto Fail;

      p = (FT_Byte*)stream->cursor;
      for ( count = 0; count <= num_subrs; count++ )
        offsets[count] = cid_get_offset( &p, (FT_Byte)dict->sd_bytes );

      FT_FRAME_EXIT();

      /* offsets must be ordered */
      for ( count = 1; count <= num_subrs; count++ )
        if ( offsets[count - 1] > offsets[count] )
        {
          FT_ERROR(( "cid_read_subrs: offsets are not ordered\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

      if ( offsets[num_subrs] > stream->size - cid->data_offset )
      {
        FT_ERROR(( "cid_read_subrs: too large `subrs' offsets\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* now, compute the size of subrs charstrings, */
      /* allocate, and read them                     */
      data_len = offsets[num_subrs] - offsets[0];

      if ( FT_NEW_ARRAY( subr->code, num_subrs + 1 ) ||
           FT_ALLOC( subr->code[0], data_len )       )
        goto Fail;

      if ( FT_STREAM_SEEK( cid->data_offset + offsets[0] ) ||
           FT_STREAM_READ( subr->code[0], data_len )  )
        goto Fail;

      /* set up pointers */
      for ( count = 1; count <= num_subrs; count++ )
      {
        FT_ULong  len;


        len               = offsets[count] - offsets[count - 1];
        subr->code[count] = subr->code[count - 1] + len;
      }

      /* decrypt subroutines, but only if lenIV >= 0 */
      if ( lenIV >= 0 )
      {
        for ( count = 0; count < num_subrs; count++ )
        {
          FT_ULong  len;


          len = offsets[count + 1] - offsets[count];
          psaux->t1_decrypt( subr->code[count], len, 4330 );
        }
      }

      subr->num_subrs = (FT_Int)num_subrs;
    }

  Exit:
    FT_FREE( offsets );
    return error;

  Fail:
    if ( face->subrs )
    {
      for ( n = 0; n < cid->num_dicts; n++ )
      {
        if ( face->subrs[n].code )
          FT_FREE( face->subrs[n].code[0] );

        FT_FREE( face->subrs[n].code );
      }
      FT_FREE( face->subrs );
    }
    goto Exit;
  }